

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerators::ParseCppFile
          (cmQtAutoGenerators *this,string *absFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headerExtensions,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *includedMocs,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  ulong uVar6;
  char *pcVar7;
  size_type sVar8;
  long lVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  undefined1 local_368 [8];
  string headerToMoc_1;
  string mocSubDir_1;
  string fileToMoc;
  undefined1 local_2e8 [8];
  string headerToMoc;
  string mocSubDir;
  undefined1 local_280 [7];
  bool moc_style;
  string basename;
  string currentMoc;
  size_type matchOffset;
  string ownMocHeaderFile;
  string ownDotMocFile;
  string ownMocUnderscoreFile;
  undefined1 local_1d0 [5];
  bool mocUnderscoreIncluded;
  bool dotMocIncluded;
  bool requiresMoc;
  string macroName;
  string scannedFileBasename;
  string local_170;
  undefined1 local_150 [8];
  string absPath;
  undefined1 local_120 [8];
  string contentsString;
  RegularExpression mocIncludeRegExp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *includedUis_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *includedMocs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headerExtensions_local;
  string *absFilename_local;
  cmQtAutoGenerators *this_local;
  
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)((long)&contentsString.field_2 + 8),
             "[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  ReadAll((string *)local_120,absFilename);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    ParseForUic(this,absFilename,(string *)local_120,includedUis);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      cmsys::SystemTools::GetRealPath
                ((string *)((long)&scannedFileBasename.field_2 + 8),absFilename,(string *)0x0);
      cmsys::SystemTools::GetFilenamePath
                (&local_170,(string *)((long)&scannedFileBasename.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     &local_170,'/');
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)(scannedFileBasename.field_2._M_local_buf + 8));
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                ((string *)((long)&macroName.field_2 + 8),absFilename);
      std::__cxx11::string::string((string *)local_1d0);
      bVar3 = requiresMocing((string *)local_120,(string *)local_1d0);
      bVar1 = false;
      bVar2 = false;
      std::__cxx11::string::string((string *)(ownDotMocFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(ownMocHeaderFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)&matchOffset);
      currentMoc.field_2._8_8_ = 0;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      pcVar7 = strstr(pcVar7,"moc");
      if ((pcVar7 != (char *)0x0) &&
         (bVar4 = cmsys::RegularExpression::find
                            ((RegularExpression *)((long)&contentsString.field_2 + 8),
                             (string *)local_120), bVar4)) {
        do {
          cmsys::RegularExpression::match_abi_cxx11_
                    ((string *)((long)&basename.field_2 + 8),
                     (RegularExpression *)((long)&contentsString.field_2 + 8),1);
          cmsys::SystemTools::GetFilenameWithoutLastExtension
                    ((string *)local_280,(string *)((long)&basename.field_2 + 8));
          bVar4 = cmHasLiteralPrefix<std::__cxx11::string,5ul>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_280,(char (*) [5])0x8f7ca3);
          if (bVar4) {
            std::__cxx11::string::substr((ulong)((long)&mocSubDir.field_2 + 8),(ulong)local_280);
            std::__cxx11::string::operator=
                      ((string *)local_280,(string *)(mocSubDir.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(mocSubDir.field_2._M_local_buf + 8));
            extractSubDir((string *)((long)&headerToMoc.field_2 + 8),(string *)local_150,
                          (string *)((long)&basename.field_2 + 8));
            findMatchingHeader((string *)local_2e8,(string *)local_150,
                               (string *)((long)&headerToMoc.field_2 + 8),(string *)local_280,
                               headerExtensions);
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) != 0) {
              poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
              poVar10 = std::operator<<(poVar10,(string *)absFilename);
              poVar10 = std::operator<<(poVar10,": The file ");
              poVar10 = std::operator<<(poVar10,"includes the moc file \"");
              poVar10 = std::operator<<(poVar10,(string *)(basename.field_2._M_local_buf + 8));
              poVar10 = std::operator<<(poVar10,"\", ");
              poVar10 = std::operator<<(poVar10,"but could not find header \"");
              poVar10 = std::operator<<(poVar10,(string *)local_280);
              poVar10 = std::operator<<(poVar10,'{');
              Join((string *)((long)&fileToMoc.field_2 + 8),this,headerExtensions,',');
              poVar10 = std::operator<<(poVar10,(string *)(fileToMoc.field_2._M_local_buf + 8));
              std::operator<<(poVar10,"}\" ");
              std::__cxx11::string::~string((string *)(fileToMoc.field_2._M_local_buf + 8));
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) == 0) {
                poVar10 = std::operator<<((ostream *)&std::cerr,"neither in ");
                poVar10 = std::operator<<(poVar10,(string *)local_150);
                poVar10 = std::operator<<(poVar10," nor in ");
                poVar10 = std::operator<<(poVar10,(string *)(headerToMoc.field_2._M_local_buf + 8));
                poVar10 = std::operator<<(poVar10,"\n");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cerr,"in ");
                poVar10 = std::operator<<(poVar10,(string *)local_150);
                poVar10 = std::operator<<(poVar10,"\n");
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              exit(1);
            }
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](includedMocs,(key_type *)local_2e8);
            std::__cxx11::string::operator=
                      ((string *)pmVar11,(string *)(basename.field_2._M_local_buf + 8));
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_280,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&macroName.field_2 + 8));
            if (_Var5) {
              bVar2 = true;
              std::__cxx11::string::operator=
                        ((string *)(ownDotMocFile.field_2._M_local_buf + 8),
                         (string *)(basename.field_2._M_local_buf + 8));
              std::__cxx11::string::operator=((string *)&matchOffset,(string *)local_2e8);
            }
            std::__cxx11::string::~string((string *)local_2e8);
            std::__cxx11::string::~string((string *)(headerToMoc.field_2._M_local_buf + 8));
          }
          else {
            std::__cxx11::string::string
                      ((string *)(mocSubDir_1.field_2._M_local_buf + 8),(string *)absFilename);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_280,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&macroName.field_2 + 8));
            if ((bVar4) || (!bVar3)) {
              extractSubDir((string *)((long)&headerToMoc_1.field_2 + 8),(string *)local_150,
                            (string *)((long)&basename.field_2 + 8));
              findMatchingHeader((string *)local_368,(string *)local_150,
                                 (string *)((long)&headerToMoc_1.field_2 + 8),(string *)local_280,
                                 headerExtensions);
              uVar6 = std::__cxx11::string::empty();
              if ((uVar6 & 1) != 0) {
                poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
                poVar10 = std::operator<<(poVar10,(string *)absFilename);
                poVar10 = std::operator<<(poVar10,": The file includes the moc file \"");
                poVar10 = std::operator<<(poVar10,(string *)(basename.field_2._M_local_buf + 8));
                poVar10 = std::operator<<(poVar10,
                                          "\", which seems to be the moc file from a different source file. CMake also could not find a matching header.\n"
                                         );
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
                exit(1);
              }
              std::__cxx11::string::operator=
                        ((string *)(mocSubDir_1.field_2._M_local_buf + 8),(string *)local_368);
              if ((bVar3) ||
                 (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_280,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&macroName.field_2 + 8)), !_Var5)) {
                poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
                poVar10 = std::operator<<(poVar10,(string *)absFilename);
                poVar10 = std::operator<<(poVar10,": The file includes the moc file \"");
                poVar10 = std::operator<<(poVar10,(string *)(basename.field_2._M_local_buf + 8));
                poVar10 = std::operator<<(poVar10,"\" instead of \"moc_");
                poVar10 = std::operator<<(poVar10,(string *)local_280);
                poVar10 = std::operator<<(poVar10,".cpp\". Running moc on ");
                poVar10 = std::operator<<(poVar10,"\"");
                poVar10 = std::operator<<(poVar10,(string *)local_368);
                poVar10 = std::operator<<(poVar10,"\" ! Include \"moc_");
                poVar10 = std::operator<<(poVar10,(string *)local_280);
                poVar10 = std::operator<<(poVar10,
                                          ".cpp\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                                         );
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
                poVar10 = std::operator<<(poVar10,(string *)absFilename);
                poVar10 = std::operator<<(poVar10,": The file includes the moc file \"");
                poVar10 = std::operator<<(poVar10,(string *)(basename.field_2._M_local_buf + 8));
                poVar10 = std::operator<<(poVar10,"\", but does not contain a ");
                poVar10 = std::operator<<(poVar10,(string *)local_1d0);
                poVar10 = std::operator<<(poVar10," macro. Running moc on ");
                poVar10 = std::operator<<(poVar10,"\"");
                poVar10 = std::operator<<(poVar10,(string *)local_368);
                poVar10 = std::operator<<(poVar10,"\" ! Include \"moc_");
                poVar10 = std::operator<<(poVar10,(string *)local_280);
                poVar10 = std::operator<<(poVar10,
                                          ".cpp\" for a compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                                         );
                std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
              }
              std::__cxx11::string::~string((string *)local_368);
              std::__cxx11::string::~string((string *)(headerToMoc_1.field_2._M_local_buf + 8));
            }
            else {
              bVar1 = true;
              std::__cxx11::string::operator=
                        ((string *)(ownMocHeaderFile.field_2._M_local_buf + 8),
                         (string *)(basename.field_2._M_local_buf + 8));
            }
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](includedMocs,(key_type *)((long)&mocSubDir_1.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)pmVar11,(string *)(basename.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(mocSubDir_1.field_2._M_local_buf + 8));
          }
          sVar8 = cmsys::RegularExpression::end
                            ((RegularExpression *)((long)&contentsString.field_2 + 8));
          currentMoc.field_2._8_8_ = sVar8 + currentMoc.field_2._8_8_;
          std::__cxx11::string::~string((string *)local_280);
          std::__cxx11::string::~string((string *)(basename.field_2._M_local_buf + 8));
          lVar9 = std::__cxx11::string::c_str();
          bVar4 = cmsys::RegularExpression::find
                            ((RegularExpression *)((long)&contentsString.field_2 + 8),
                             (char *)(lVar9 + currentMoc.field_2._8_8_));
        } while (bVar4);
      }
      if ((!bVar1) && (bVar3)) {
        if (!bVar2) {
          poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: ");
          poVar10 = std::operator<<(poVar10,(string *)absFilename);
          poVar10 = std::operator<<(poVar10,": The file ");
          poVar10 = std::operator<<(poVar10,"contains a ");
          poVar10 = std::operator<<(poVar10,(string *)local_1d0);
          poVar10 = std::operator<<(poVar10," macro, but does not include ");
          poVar10 = std::operator<<(poVar10,"\"");
          poVar10 = std::operator<<(poVar10,(string *)(macroName.field_2._M_local_buf + 8));
          poVar10 = std::operator<<(poVar10,".moc\" !\n");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
        poVar10 = std::operator<<(poVar10,(string *)absFilename);
        poVar10 = std::operator<<(poVar10,": The file ");
        poVar10 = std::operator<<(poVar10,"contains a ");
        poVar10 = std::operator<<(poVar10,(string *)local_1d0);
        poVar10 = std::operator<<(poVar10," macro, but does not include ");
        poVar10 = std::operator<<(poVar10,"\"");
        poVar10 = std::operator<<(poVar10,(string *)(macroName.field_2._M_local_buf + 8));
        poVar10 = std::operator<<(poVar10,".moc\", but instead includes ");
        poVar10 = std::operator<<(poVar10,"\"");
        poVar10 = std::operator<<(poVar10,(string *)(ownDotMocFile.field_2._M_local_buf + 8));
        poVar10 = std::operator<<(poVar10,"\". Running moc on ");
        poVar10 = std::operator<<(poVar10,"\"");
        poVar10 = std::operator<<(poVar10,(string *)absFilename);
        poVar10 = std::operator<<(poVar10,"\" ! Better include \"");
        poVar10 = std::operator<<(poVar10,(string *)(macroName.field_2._M_local_buf + 8));
        poVar10 = std::operator<<(poVar10,
                                  ".moc\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                                 );
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](includedMocs,absFilename);
        std::__cxx11::string::operator=
                  ((string *)pmVar11,(string *)(ownDotMocFile.field_2._M_local_buf + 8));
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::erase(includedMocs,(key_type *)&matchOffset);
      }
      std::__cxx11::string::~string((string *)&matchOffset);
      std::__cxx11::string::~string((string *)(ownMocHeaderFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(ownDotMocFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::string::~string((string *)(macroName.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_150);
      absPath.field_2._8_4_ = 0;
    }
    else {
      absPath.field_2._8_4_ = 1;
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: warning: ");
    poVar10 = std::operator<<(poVar10,(string *)absFilename);
    poVar10 = std::operator<<(poVar10,": file is empty\n");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    absPath.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_120);
  cmsys::RegularExpression::~RegularExpression
            ((RegularExpression *)((long)&contentsString.field_2 + 8));
  return;
}

Assistant:

void cmQtAutoGenerators::ParseCppFile(const std::string& absFilename,
                const std::vector<std::string>& headerExtensions,
                std::map<std::string, std::string>& includedMocs,
                std::map<std::string, std::vector<std::string> > &includedUis)
{
  cmsys::RegularExpression mocIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]");

  const std::string contentsString = ReadAll(absFilename);
  if (contentsString.empty())
    {
    std::cerr << "AUTOGEN: warning: " << absFilename << ": file is empty\n"
              << std::endl;
    return;
    }
  this->ParseForUic(absFilename, contentsString, includedUis);
  if (this->MocExecutable.empty())
    {
    return;
    }

  const std::string absPath = cmsys::SystemTools::GetFilenamePath(
                   cmsys::SystemTools::GetRealPath(absFilename)) + '/';
  const std::string scannedFileBasename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFilename);
  std::string macroName;
  const bool requiresMoc = requiresMocing(contentsString, macroName);
  bool dotMocIncluded = false;
  bool mocUnderscoreIncluded = false;
  std::string ownMocUnderscoreFile;
  std::string ownDotMocFile;
  std::string ownMocHeaderFile;

  std::string::size_type matchOffset = 0;
  // first a simple string check for "moc" is *much* faster than the regexp,
  // and if the string search already fails, we don't have to try the
  // expensive regexp
  if ((strstr(contentsString.c_str(), "moc") != NULL)
                                    && (mocIncludeRegExp.find(contentsString)))
    {
    // for every moc include in the file
    do
      {
      const std::string currentMoc = mocIncludeRegExp.match(1);
      //std::cout << "found moc include: " << currentMoc << std::endl;

      std::string basename = cmsys::SystemTools::
                                   GetFilenameWithoutLastExtension(currentMoc);
      const bool moc_style = cmHasLiteralPrefix(basename, "moc_");

      // If the moc include is of the moc_foo.cpp style we expect
      // the Q_OBJECT class declaration in a header file.
      // If the moc include is of the foo.moc style we need to look for
      // a Q_OBJECT macro in the current source file, if it contains the
      // macro we generate the moc file from the source file.
      // Q_OBJECT
      if (moc_style)
        {
        // basename should be the part of the moc filename used for
        // finding the correct header, so we need to remove the moc_ part
        basename = basename.substr(4);
        std::string mocSubDir = extractSubDir(absPath, currentMoc);
        std::string headerToMoc = findMatchingHeader(
                               absPath, mocSubDir, basename, headerExtensions);

        if (!headerToMoc.empty())
          {
          includedMocs[headerToMoc] = currentMoc;
          if (basename == scannedFileBasename)
            {
            mocUnderscoreIncluded = true;
            ownMocUnderscoreFile = currentMoc;
            ownMocHeaderFile = headerToMoc;
            }
          }
        else
          {
          std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                    << "includes the moc file \"" << currentMoc << "\", "
                    << "but could not find header \"" << basename
                    << '{' << this->Join(headerExtensions, ',') << "}\" ";
          if (mocSubDir.empty())
            {
            std::cerr << "in " << absPath << "\n" << std::endl;
            }
          else
            {
            std::cerr << "neither in " << absPath
                      << " nor in " << mocSubDir << "\n" << std::endl;
            }

          ::exit(EXIT_FAILURE);
          }
        }
      else
        {
        std::string fileToMoc = absFilename;
        if ((basename != scannedFileBasename) || (requiresMoc==false))
          {
          std::string mocSubDir = extractSubDir(absPath, currentMoc);
          std::string headerToMoc = findMatchingHeader(
                              absPath, mocSubDir, basename, headerExtensions);
          if (!headerToMoc.empty())
            {
            // this is for KDE4 compatibility:
            fileToMoc = headerToMoc;
            if ((requiresMoc==false) &&(basename==scannedFileBasename))
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\", but does not contain a " << macroName
                            << " macro. Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for a compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            else
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\" instead of \"moc_" << basename << ".cpp\". "
                            "Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            }
          else
            {
            std::cerr <<"AUTOGEN: error: " << absFilename << ": The file "
                        "includes the moc file \"" << currentMoc <<
                        "\", which seems to be the moc file from a different "
                        "source file. CMake also could not find a matching "
                        "header.\n" << std::endl;
            ::exit(EXIT_FAILURE);
            }
          }
        else
          {
          dotMocIncluded = true;
          ownDotMocFile = currentMoc;
          }
        includedMocs[fileToMoc] = currentMoc;
        }
      matchOffset += mocIncludeRegExp.end();
      } while(mocIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }

  // In this case, check whether the scanned file itself contains a Q_OBJECT.
  // If this is the case, the moc_foo.cpp should probably be generated from
  // foo.cpp instead of foo.h, because otherwise it won't build.
  // But warn, since this is not how it is supposed to be used.
  if ((dotMocIncluded == false) && (requiresMoc == true))
    {
    if (mocUnderscoreIncluded == true)
      {
      // this is for KDE4 compatibility:
      std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\", but instead "
                   "includes "
                << "\"" << ownMocUnderscoreFile  << "\". Running moc on "
                << "\"" << absFilename << "\" ! Better include \""
                << scannedFileBasename << ".moc\" for compatiblity with "
                   "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                << std::endl;
      includedMocs[absFilename] = ownMocUnderscoreFile;
      includedMocs.erase(ownMocHeaderFile);
      }
    else
      {
      // otherwise always error out since it will not compile:
      std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\" !\n"
                << std::endl;
      ::exit(EXIT_FAILURE);
      }
    }

}